

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

UBool __thiscall
icu_63::CollationFastLatinBuilder::loadGroups
          (CollationFastLatinBuilder *this,CollationData *data,UErrorCode *errorCode)

{
  uint32_t uVar1;
  int32_t i;
  long lVar2;
  UChar local_2c [2];
  
  if (U_ZERO_ERROR < *errorCode) {
    return '\0';
  }
  this->headerLength = 5;
  local_2c[1] = 0x205;
  lVar2 = 0;
  icu_63::UnicodeString::doAppend(&this->result,local_2c + 1,0,1);
  do {
    uVar1 = CollationData::getLastPrimaryForGroup(data,(uint)lVar2 | 0x1000);
    this->lastSpecialPrimaries[lVar2] = uVar1;
    if (uVar1 == 0) {
      return '\0';
    }
    local_2c[0] = L'\0';
    icu_63::UnicodeString::doAppend(&this->result,local_2c,0,1);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  uVar1 = CollationData::getFirstPrimaryForGroup(data,0x1004);
  this->firstDigitPrimary = uVar1;
  uVar1 = CollationData::getFirstPrimaryForGroup(data,0x19);
  this->firstLatinPrimary = uVar1;
  uVar1 = CollationData::getLastPrimaryForGroup(data,0x19);
  this->lastLatinPrimary = uVar1;
  return this->firstLatinPrimary != 0 && this->firstDigitPrimary != 0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }